

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadPaths(CrateReader *this)

{
  long lVar1;
  pointer pSVar2;
  StreamReader *this_00;
  ulong uVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  uint64_t num_paths;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  ostringstream local_208 [376];
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = this->_paths_index;
  if ((lVar1 < 0) ||
     (pSVar2 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5 <= lVar1)) {
    ::std::__cxx11::ostringstream::ostringstream(local_208);
    poVar5 = ::std::operator<<((ostream *)local_208,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ReadPaths");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x17f8);
    ::std::operator<<(poVar5," ");
    pcVar8 = "Invalid index for `PATHS` section.";
  }
  else {
    if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
      ::std::__cxx11::ostringstream::ostringstream(local_208);
      poVar5 = ::std::operator<<((ostream *)local_208,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReadPaths");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x17ff);
      ::std::operator<<(poVar5," ");
      ::std::__cxx11::to_string(&local_268,(uint)this->_version[0]);
      ::std::operator+(&local_248,"Version must be 0.4.0 or later, but got ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_268);
      ::std::operator+(&local_228,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_248,".");
      ::std::__cxx11::to_string(&local_70,(uint)this->_version[1]);
      ::std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_228,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_70);
      ::std::operator+(&local_288,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_50,".");
      ::std::__cxx11::to_string(&local_90,(uint)this->_version[2]);
      ::std::operator+(&bStack_2a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_288,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_90);
      poVar5 = ::std::operator<<((ostream *)local_208,(string *)&bStack_2a8);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)&this->_err);
      ::std::__cxx11::string::_M_dispose();
      goto LAB_00190092;
    }
    this_00 = this->_sr;
    uVar3 = pSVar2[lVar1].start;
    if (this_00->length_ < uVar3) {
      ::std::__cxx11::ostringstream::ostringstream(local_208);
      poVar5 = ::std::operator<<((ostream *)local_208,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReadPaths");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1806);
      ::std::operator<<(poVar5," ");
      pcVar8 = "Failed to move to `PATHS` section.";
    }
    else {
      this_00->idx_ = uVar3;
      bVar4 = StreamReader::read8(this_00,(uint64_t *)&local_288);
      if (bVar4) {
        if (local_288._M_dataplus._M_p == (pointer)0x0) {
          ::std::__cxx11::ostringstream::ostringstream(local_208);
          poVar5 = ::std::operator<<((ostream *)local_208,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReadPaths");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1812);
          ::std::operator<<(poVar5," ");
          pcVar8 = "`PATHS` is empty.";
        }
        else if ((pointer)(this->_config).maxNumPaths < local_288._M_dataplus._M_p) {
          ::std::__cxx11::ostringstream::ostringstream(local_208);
          poVar5 = ::std::operator<<((ostream *)local_208,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReadPaths");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1816);
          ::std::operator<<(poVar5," ");
          pcVar8 = "Too many Paths in `PATHS` section.";
        }
        else {
          uVar6 = this->_memoryUsage + (long)local_288._M_dataplus._M_p * 0xd0;
          this->_memoryUsage = uVar6;
          uVar3 = (this->_config).maxMemoryBudget;
          if (uVar3 < uVar6) {
            ::std::__cxx11::ostringstream::ostringstream(local_208);
            poVar5 = ::std::operator<<((ostream *)local_208,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,"[Crate]");
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReadPaths");
            poVar5 = ::std::operator<<(poVar5,"():");
            iVar7 = 0x1819;
          }
          else {
            uVar6 = uVar6 + (long)local_288._M_dataplus._M_p * 0xd0;
            this->_memoryUsage = uVar6;
            if (uVar3 < uVar6) {
              ::std::__cxx11::ostringstream::ostringstream(local_208);
              poVar5 = ::std::operator<<((ostream *)local_208,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,"[Crate]");
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReadPaths");
              poVar5 = ::std::operator<<(poVar5,"():");
              iVar7 = 0x181a;
            }
            else {
              uVar6 = uVar6 + (long)local_288._M_dataplus._M_p * 0x1f8;
              this->_memoryUsage = uVar6;
              if (uVar6 <= uVar3) {
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::resize
                          (&this->_paths,(size_type)local_288._M_dataplus._M_p);
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::resize
                          (&this->_elemPaths,(size_type)local_288._M_dataplus._M_p);
                ::std::
                vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                ::resize(&this->_nodes,(size_type)local_288._M_dataplus._M_p);
                bVar4 = ReadCompressedPaths(this,(uint64_t)local_288._M_dataplus._M_p);
                if (bVar4) {
                  return true;
                }
                ::std::__cxx11::ostringstream::ostringstream(local_208);
                poVar5 = ::std::operator<<((ostream *)local_208,"[error]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"ReadPaths");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1822);
                ::std::operator<<(poVar5," ");
                pcVar8 = "Failed to read compressed paths.";
                goto LAB_0019004b;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_208);
              poVar5 = ::std::operator<<((ostream *)local_208,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,"[Crate]");
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReadPaths");
              poVar5 = ::std::operator<<(poVar5,"():");
              iVar7 = 0x181b;
            }
          }
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,iVar7);
          ::std::operator<<(poVar5," ");
          pcVar8 = "Reached to max memory budget.";
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_208);
        poVar5 = ::std::operator<<((ostream *)local_208,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReadPaths");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x180c);
        ::std::operator<<(poVar5," ");
        pcVar8 = "Failed to read # of paths at `PATHS` section.";
      }
    }
  }
LAB_0019004b:
  poVar5 = ::std::operator<<((ostream *)local_208,pcVar8);
  ::std::operator<<(poVar5,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
LAB_00190092:
  ::std::__cxx11::ostringstream::~ostringstream(local_208);
  return false;
}

Assistant:

bool CrateReader::ReadPaths() {
  if ((_paths_index < 0) || (_paths_index >= int64_t(_toc.sections.size()))) {
    PUSH_ERROR("Invalid index for `PATHS` section.");
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    PUSH_ERROR("Version must be 0.4.0 or later, but got " +
               std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
               "." + std::to_string(_version[2]));
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_paths_index)];

  if (!_sr->seek_set(uint64_t(s.start))) {
    PUSH_ERROR("Failed to move to `PATHS` section.");
    return false;
  }

  uint64_t num_paths;
  if (!_sr->read8(&num_paths)) {
    PUSH_ERROR("Failed to read # of paths at `PATHS` section.");
    return false;
  }

  if (num_paths == 0) {
    // At least root path exits.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`PATHS` is empty.");
  }

  if (num_paths > _config.maxNumPaths) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many Paths in `PATHS` section.");
  }

  CHECK_MEMORY_USAGE(size_t(num_paths) * sizeof(Path)); // conservative estimation
  CHECK_MEMORY_USAGE(size_t(num_paths) * sizeof(Path)); // conservative estimation
  CHECK_MEMORY_USAGE(size_t(num_paths) * sizeof(Node)); // conservative estimation

  _paths.resize(static_cast<size_t>(num_paths));
  _elemPaths.resize(static_cast<size_t>(num_paths));
  _nodes.resize(static_cast<size_t>(num_paths));

  if (!ReadCompressedPaths(num_paths)) {
    PUSH_ERROR("Failed to read compressed paths.");
    return false;
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  DCOUT("# of paths " << _paths.size());

  for (size_t i = 0; i < _paths.size(); i++) {
    DCOUT("path[" << i << "] = " << _paths[i].full_path_name());
  }
#endif

  return true;
}